

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

void __thiscall
MODEL3D::three_dim_model::generate_freecad_solid
          (three_dim_model *this,Paths *primary,Paths *secondary,bool *has_holes,int *layer_number,
          int *mask_type)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  mapped_type *pmVar4;
  pointer ppVar5;
  reference pvVar6;
  mapped_type *pmVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *local_d28;
  int local_d1c;
  int local_d18;
  bool local_d11;
  point *local_d10;
  __normal_iterator<GEO::point_*,_std::vector<GEO::point,_std::allocator<GEO::point>_>_> local_d08;
  double local_d00;
  double offset_value_1;
  ClipperOffset co_1;
  Paths adjusted_paths_1;
  const_iterator primary_it_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb8;
  string local_b98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b78;
  string local_b58;
  string local_b38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  string local_a98;
  string local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  string local_9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *local_8d8;
  int local_8cc;
  int local_8c8;
  bool local_8c1;
  point *local_8c0;
  __normal_iterator<GEO::point_*,_std::vector<GEO::point,_std::allocator<GEO::point>_>_> local_8b8;
  double local_8b0;
  double offset_value;
  ClipperOffset co;
  Paths adjusted_paths;
  const_iterator primary_it_1;
  const_iterator primary_end_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  string local_740;
  undefined1 local_720 [8];
  string sub_layer;
  string local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  string local_660;
  string local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  string local_5a0;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  string local_500;
  string local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  string local_460;
  string local_440;
  string local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *local_340;
  bool local_332;
  bool local_331;
  const_iterator cStack_330;
  bool bot_strt_1;
  const_iterator secondary_it;
  const_iterator secondary_end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  bool local_d9;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *local_d8;
  bool local_c9;
  double local_c8;
  double o_f;
  const_iterator cStack_b8;
  bool bot_strt;
  const_iterator primary_it;
  const_iterator primary_end;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int *local_38;
  int *mask_type_local;
  int *layer_number_local;
  bool *has_holes_local;
  Paths *secondary_local;
  Paths *primary_local;
  three_dim_model *this_local;
  
  local_38 = mask_type;
  mask_type_local = layer_number;
  layer_number_local = (int *)has_holes;
  has_holes_local = (bool *)secondary;
  secondary_local = primary;
  primary_local = (Paths *)this;
  std::__cxx11::to_string(&local_98,*layer_number);
  std::operator+(&local_78,"    additive_ingredients_",&local_98);
  std::operator+(&local_58,&local_78," = []");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  primary_it = std::
               vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               ::end(secondary_local);
  cStack_b8 = std::
              vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ::begin(secondary_local);
  while (bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffff48,&primary_it), bVar1) {
    local_c8 = this->additive_overlap_factor;
    o_f._7_1_ = *local_38 == 1;
    if (*local_38 == 3) {
      local_c8 = 1.0;
    }
    pvVar3 = __gnu_cxx::
             __normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
             ::operator*(&stack0xffffffffffffff48);
    local_c9 = true;
    push_freecad_pss(this,pvVar3,(bool *)((long)&o_f + 7),mask_type_local,&local_c9,&local_c8);
    local_d8 = (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
               __gnu_cxx::
               __normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
               ::operator++(&stack0xffffffffffffff48,0);
  }
  local_d9 = true;
  build_additive_shapes(this,mask_type_local,&local_d9);
  std::__cxx11::to_string(&local_180,*mask_type_local);
  std::operator+(&local_160,"    additive_fuse_",&local_180);
  std::operator+(&local_140,&local_160,"= additives_");
  std::__cxx11::to_string(&local_1a0,*mask_type_local);
  std::operator+(&local_120,&local_140,&local_1a0);
  std::operator+(&local_100,&local_120,"[0]");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::to_string(&local_280,*mask_type_local);
  std::operator+(&local_260,"    additive_fuse_",&local_280);
  std::operator+(&local_240,&local_260," = additive_fuse_");
  std::__cxx11::to_string(&local_2a0,*mask_type_local);
  std::operator+(&local_220,&local_240,&local_2a0);
  std::operator+(&local_200,&local_220,".fuse(additives_");
  std::__cxx11::to_string(&local_2c0,*mask_type_local);
  std::operator+(&local_1e0,&local_200,&local_2c0);
  std::operator+(&local_1c0,&local_1e0,")");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  sVar2 = std::
          vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ::size((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  *)has_holes_local);
  if (sVar2 == 0) {
    std::__cxx11::to_string(&local_580,*mask_type_local);
    std::operator+(&local_560,"    layer_",&local_580);
    std::operator+(&local_540,&local_560,"=additive_fuse_");
    std::__cxx11::to_string(&local_5a0,*mask_type_local);
    std::operator+(&local_520,&local_540,&local_5a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_520);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_580);
  }
  else {
    std::__cxx11::to_string((string *)&secondary_end,*mask_type_local);
    std::operator+(&local_300,"    subtractive_ingredients_",(string *)&secondary_end);
    std::operator+(&local_2e0,&local_300," = []");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&secondary_end);
    secondary_it = std::
                   vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ::end((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                          *)has_holes_local);
    cStack_330 = std::
                 vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 ::begin((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                          *)has_holes_local);
    while (bVar1 = __gnu_cxx::operator!=(&stack0xfffffffffffffcd0,&secondary_it), bVar1) {
      local_331 = *local_38 != 1;
      pvVar3 = __gnu_cxx::
               __normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
               ::operator*(&stack0xfffffffffffffcd0);
      local_332 = false;
      push_freecad_pss(this,pvVar3,&local_331,mask_type_local,&local_332,
                       &this->subtractive_overlap_factor);
      local_340 = (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                  __gnu_cxx::
                  __normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                  ::operator++(&stack0xfffffffffffffcd0,0);
    }
    build_subtractive_shapes(this,mask_type_local);
    std::__cxx11::to_string(&local_420,*mask_type_local);
    std::operator+(&local_400,"    subtractive_cut_",&local_420);
    std::operator+(&local_3e0,&local_400,"= additive_fuse_");
    std::__cxx11::to_string(&local_440,*mask_type_local);
    std::operator+(&local_3c0,&local_3e0,&local_440);
    std::operator+(&local_3a0,&local_3c0,".cut(subtractives_");
    std::__cxx11::to_string(&local_460,*mask_type_local);
    std::operator+(&local_380,&local_3a0,&local_460);
    std::operator+(&local_360,&local_380,")");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::to_string(&local_4e0,*mask_type_local);
    std::operator+(&local_4c0,"layer_",&local_4e0);
    std::operator+(&local_4a0,&local_4c0," = subtractive_cut_");
    std::__cxx11::to_string(&local_500,*mask_type_local);
    std::operator+(&local_480,&local_4a0,&local_500);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_4e0);
  }
  std::__cxx11::to_string(&local_640,*mask_type_local);
  std::operator+(&local_620,"    lyr_",&local_640);
  std::operator+(&local_600,&local_620," = My_doc.addObject(\"Part::Feature\",\"layer_");
  std::__cxx11::to_string(&local_660,*mask_type_local);
  std::operator+(&local_5e0,&local_600,&local_660);
  std::operator+(&local_5c0,&local_5e0,"\")");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_5c0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_660);
  std::__cxx11::string::~string((string *)&local_600);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::~string((string *)&local_640);
  std::__cxx11::to_string(&local_6e0,*mask_type_local);
  std::operator+(&local_6c0,"    lyr_",&local_6e0);
  std::operator+(&local_6a0,&local_6c0,".Shape = layer_");
  std::__cxx11::to_string((string *)((long)&sub_layer.field_2 + 8),*mask_type_local);
  std::operator+(&local_680,&local_6a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&sub_layer.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_680);
  std::__cxx11::string::~string((string *)&local_680);
  std::__cxx11::string::~string((string *)(sub_layer.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_6a0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::__cxx11::string::~string((string *)&local_6e0);
  if (*local_38 == 3) {
    std::__cxx11::to_string(&local_740,*mask_type_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720,
                   &local_740,"_Al");
    std::__cxx11::string::~string((string *)&local_740);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &primary_end_1,"    additive_ingredients_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720);
    std::operator+(&local_760,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &primary_end_1," = []");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_760);
    std::__cxx11::string::~string((string *)&local_760);
    std::__cxx11::string::~string((string *)&primary_end_1);
    primary_it_1 = std::
                   vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ::end(secondary_local);
    adjusted_paths.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  ::begin(secondary_local);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                               *)&adjusted_paths.
                                  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&primary_it_1),
          bVar1) {
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                *)&co.m_polyNodes.m_jointype);
      ClipperLib::ClipperOffset::ClipperOffset((ClipperOffset *)&offset_value,2.0,0.25);
      ClipperLib::ClipperOffset::Clear((ClipperOffset *)&offset_value);
      pvVar3 = __gnu_cxx::
               __normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
               ::operator*((__normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                            *)&adjusted_paths.
                               super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ClipperLib::ClipperOffset::AddPath
                ((ClipperOffset *)&offset_value,pvVar3,jtSquare,etClosedPolygon);
      pmVar4 = std::
               map<int,_std::vector<GEO::point,_std::allocator<GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>_>_>
               ::operator[](&this->etch_contour_map,mask_type_local);
      local_8c0 = (point *)std::vector<GEO::point,_std::allocator<GEO::point>_>::end(pmVar4);
      local_8b8 = std::
                  prev<__gnu_cxx::__normal_iterator<GEO::point*,std::vector<GEO::point,std::allocator<GEO::point>>>>
                            ((__normal_iterator<GEO::point_*,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>
                              )local_8c0,1);
      ppVar5 = __gnu_cxx::
               __normal_iterator<GEO::point_*,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>
               ::operator->(&local_8b8);
      local_8b0 = ppVar5->x;
      ClipperLib::ClipperOffset::Execute
                ((ClipperOffset *)&offset_value,(Paths *)&co.m_polyNodes.m_jointype,local_8b0);
      pvVar6 = std::
               vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               ::operator[]((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                             *)&co.m_polyNodes.m_jointype,0);
      local_8c1 = true;
      pmVar7 = std::
               map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
               ::operator[](&this->proc_info_map,mask_type_local);
      local_8c8 = pmVar7->z_start + -9;
      local_8cc = 8;
      push_freecad_prism(this,pvVar6,&local_8c1,&local_8c8,&local_8cc,(string *)local_720);
      ClipperLib::ClipperOffset::~ClipperOffset((ClipperOffset *)&offset_value);
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 *)&co.m_polyNodes.m_jointype);
      local_8d8 = (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                  __gnu_cxx::
                  __normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                  ::operator++((__normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                                *)&adjusted_paths.
                                   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    }
    build_additive_sub_layer(this,(string *)local_720);
    std::__cxx11::to_string(&local_9d8,*mask_type_local);
    std::operator+(&local_9b8,"    layer_",&local_9d8);
    std::operator+(&local_998,&local_9b8,"_Al = ");
    std::operator+(&local_978,&local_998,"additives_");
    std::operator+(&local_958,&local_978,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720);
    std::operator+(&local_938,&local_958,"[0].fuse(additives_");
    std::operator+(&local_918,&local_938,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720);
    std::operator+(&local_8f8,&local_918,")");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_8f8);
    std::__cxx11::string::~string((string *)&local_8f8);
    std::__cxx11::string::~string((string *)&local_918);
    std::__cxx11::string::~string((string *)&local_938);
    std::__cxx11::string::~string((string *)&local_958);
    std::__cxx11::string::~string((string *)&local_978);
    std::__cxx11::string::~string((string *)&local_998);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::__cxx11::string::~string((string *)&local_9d8);
    std::__cxx11::to_string(&local_a78,*mask_type_local);
    std::operator+(&local_a58,"    lyr_",&local_a78);
    std::operator+(&local_a38,&local_a58,"_Al = My_doc.addObject(\"Part::Feature\",\"layer_");
    std::__cxx11::to_string(&local_a98,*mask_type_local);
    std::operator+(&local_a18,&local_a38,&local_a98);
    std::operator+(&local_9f8,&local_a18,"_Al\")");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_9f8);
    std::__cxx11::string::~string((string *)&local_9f8);
    std::__cxx11::string::~string((string *)&local_a18);
    std::__cxx11::string::~string((string *)&local_a98);
    std::__cxx11::string::~string((string *)&local_a38);
    std::__cxx11::string::~string((string *)&local_a58);
    std::__cxx11::string::~string((string *)&local_a78);
    std::__cxx11::to_string(&local_b38,*mask_type_local);
    std::operator+(&local_b18,"    lyr_",&local_b38);
    std::operator+(&local_af8,&local_b18,"_Al.Shape = layer_");
    std::__cxx11::to_string(&local_b58,*mask_type_local);
    std::operator+(&local_ad8,&local_af8,&local_b58);
    std::operator+(&local_ab8,&local_ad8,"_Al");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_ab8);
    std::__cxx11::string::~string((string *)&local_ab8);
    std::__cxx11::string::~string((string *)&local_ad8);
    std::__cxx11::string::~string((string *)&local_b58);
    std::__cxx11::string::~string((string *)&local_af8);
    std::__cxx11::string::~string((string *)&local_b18);
    std::__cxx11::string::~string((string *)&local_b38);
    std::__cxx11::to_string(&local_b98,*mask_type_local);
    std::operator+(&local_b78,&local_b98,"_AlOx");
    std::__cxx11::string::operator=((string *)local_720,(string *)&local_b78);
    std::__cxx11::string::~string((string *)&local_b78);
    std::__cxx11::string::~string((string *)&local_b98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &primary_it_2,"    additive_ingredients_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720);
    std::operator+(&local_bb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &primary_it_2," = []");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_bb8);
    std::__cxx11::string::~string((string *)&local_bb8);
    std::__cxx11::string::~string((string *)&primary_it_2);
    adjusted_paths_1.
    super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  ::begin(secondary_local);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                               *)&adjusted_paths_1.
                                  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&primary_it_1),
          bVar1) {
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                *)&co_1.m_polyNodes.m_jointype);
      ClipperLib::ClipperOffset::ClipperOffset((ClipperOffset *)&offset_value_1,2.0,0.25);
      ClipperLib::ClipperOffset::Clear((ClipperOffset *)&offset_value_1);
      pvVar3 = __gnu_cxx::
               __normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
               ::operator*((__normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                            *)&adjusted_paths_1.
                               super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ClipperLib::ClipperOffset::AddPath
                ((ClipperOffset *)&offset_value_1,pvVar3,jtSquare,etClosedPolygon);
      pmVar4 = std::
               map<int,_std::vector<GEO::point,_std::allocator<GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>_>_>
               ::operator[](&this->etch_contour_map,mask_type_local);
      local_d10 = (point *)std::vector<GEO::point,_std::allocator<GEO::point>_>::end(pmVar4);
      local_d08 = std::
                  prev<__gnu_cxx::__normal_iterator<GEO::point*,std::vector<GEO::point,std::allocator<GEO::point>>>>
                            ((__normal_iterator<GEO::point_*,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>
                              )local_d10,1);
      ppVar5 = __gnu_cxx::
               __normal_iterator<GEO::point_*,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>
               ::operator->(&local_d08);
      local_d00 = ppVar5->x;
      ClipperLib::ClipperOffset::Execute
                ((ClipperOffset *)&offset_value_1,(Paths *)&co_1.m_polyNodes.m_jointype,local_d00);
      pvVar6 = std::
               vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               ::operator[]((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                             *)&co_1.m_polyNodes.m_jointype,0);
      local_d11 = true;
      pmVar7 = std::
               map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
               ::operator[](&this->proc_info_map,mask_type_local);
      local_d18 = pmVar7->z_start + -1;
      local_d1c = 1;
      push_freecad_prism(this,pvVar6,&local_d11,&local_d18,&local_d1c,(string *)local_720);
      ClipperLib::ClipperOffset::~ClipperOffset((ClipperOffset *)&offset_value_1);
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 *)&co_1.m_polyNodes.m_jointype);
      local_d28 = (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                  __gnu_cxx::
                  __normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                  ::operator++((__normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                                *)&adjusted_paths_1.
                                   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    }
    build_additive_sub_layer(this,(string *)local_720);
    std::operator+(&local_de8,"    layer_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720);
    std::operator+(&local_dc8,&local_de8," = additives_");
    std::operator+(&local_da8,&local_dc8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720);
    std::operator+(&local_d88,&local_da8,"[0].fuse(additives_");
    std::operator+(&local_d68,&local_d88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720);
    std::operator+(&local_d48,&local_d68,")");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_d48);
    std::__cxx11::string::~string((string *)&local_d48);
    std::__cxx11::string::~string((string *)&local_d68);
    std::__cxx11::string::~string((string *)&local_d88);
    std::__cxx11::string::~string((string *)&local_da8);
    std::__cxx11::string::~string((string *)&local_dc8);
    std::__cxx11::string::~string((string *)&local_de8);
    std::operator+(&local_e68,"    lyr_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720);
    std::operator+(&local_e48,&local_e68," = My_doc.addObject(\"Part::Feature\",\"layer_");
    std::operator+(&local_e28,&local_e48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720);
    std::operator+(&local_e08,&local_e28,"\")");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_e08);
    std::__cxx11::string::~string((string *)&local_e08);
    std::__cxx11::string::~string((string *)&local_e28);
    std::__cxx11::string::~string((string *)&local_e48);
    std::__cxx11::string::~string((string *)&local_e68);
    std::operator+(&local_ec8,"    lyr_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720);
    std::operator+(&local_ea8,&local_ec8,".Shape = layer_");
    std::operator+(&local_e88,&local_ea8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_e88);
    std::__cxx11::string::~string((string *)&local_e88);
    std::__cxx11::string::~string((string *)&local_ea8);
    std::__cxx11::string::~string((string *)&local_ec8);
    std::__cxx11::string::~string((string *)local_720);
  }
  return;
}

Assistant:

void MODEL3D::three_dim_model::generate_freecad_solid(
const ClipperLib::Paths &primary,
const ClipperLib::Paths &secondary,
const bool &has_holes,
const int &layer_number,
const int &mask_type)
{
  // Create the list of additive shapes
    py_script.push_back("    additive_ingredients_"+std::to_string(layer_number)+" = []");
    auto primary_end = primary.end();
    for (auto primary_it = primary.begin();
         primary_it != primary_end;
         primary_it++)
    {
        bool bot_strt = false;//type 0 and 3
        double o_f = additive_overlap_factor;
        if(mask_type==1)// 0 = Standard /^##^\ , 1 = Inverted \_##_/
            bot_strt = true;
        // // Don't overlap on the counter-electrode layer or layer 55 because
        // // layers with circular shapes bug out in the fuse operation of
        // // create_pss. TODO: Still looking for a solution to this.
        // // Layer 51 and 55 have circular shapes
        if((mask_type==3)/*||(layer_number==55)*/)
            o_f = 1;
        push_freecad_pss(*primary_it, bot_strt, layer_number, true, o_f);
    }
    // Build them in python as a list
    build_additive_shapes(layer_number, true);
    // Execute the boolean fuse
    py_script.push_back("    additive_fuse_"    //taking first element of the list
    +std::to_string(layer_number)
    +"= additives_"+std::to_string(layer_number)
    +"[0]");
    py_script.push_back("    additive_fuse_"
    +std::to_string(layer_number)
    +" = additive_fuse_"
    +std::to_string(layer_number)
    +".fuse(additives_"+std::to_string(layer_number)+")");
    // Create a list of subtractive shapes if they exist
    if(secondary.size()>0)
    {
        py_script.push_back("    subtractive_ingredients_"+std::to_string(layer_number)+" = []");
        auto secondary_end = secondary.end();
        for (auto secondary_it = secondary.begin();
            secondary_it != secondary_end;
            secondary_it++)
        {
            bool bot_strt = true;// swapped around from above because placing back
            if(mask_type==1)// 0 = Standard /^##^\ , 1 = Inverted \_##_/
                bot_strt = false;
            push_freecad_pss(*secondary_it, bot_strt, layer_number, false, subtractive_overlap_factor);
        }
        // Build subtractive shapes in python as a list
        build_subtractive_shapes(layer_number);
        // Execute the boolean cut and name it layer
        py_script.push_back("    subtractive_cut_"
        +std::to_string(layer_number)
        +"= additive_fuse_"
        +std::to_string(layer_number)
        +".cut(subtractives_"
        +std::to_string(layer_number)+")");
        py_script.push_back("layer_"
        +std::to_string(layer_number)
        +" = subtractive_cut_"
        + std::to_string(layer_number));
    }
    else// Otherwise name the layer boolean fuse
    {
        py_script.push_back("    layer_"
        +std::to_string(layer_number)
        +"=additive_fuse_"
        +std::to_string(layer_number));
    }
    // py_script.push_back("    Part.show(layer_"
    // +std::to_string(layer_number)+")");
    py_script.push_back("    lyr_"
    +std::to_string(layer_number)+" = My_doc.addObject(\"Part::Feature\",\"layer_"
    +std::to_string(layer_number)+"\")");
    py_script.push_back("    lyr_"+std::to_string(layer_number)
    +".Shape = layer_"+std::to_string(layer_number));
    // Extra work for junction layer case
    if(mask_type==3)
    {
        // Create list of all Al shapes.
        std::string sub_layer = std::to_string(layer_number)+"_Al";
        py_script.push_back("    additive_ingredients_"+sub_layer+" = []");
        auto primary_end = primary.end();
        for (auto primary_it = primary.begin();
            primary_it != primary_end;
            primary_it++)
        {
            //offset the path in question by the contour-width to make flush with counter-electrode
            ClipperLib::Paths adjusted_paths;
            ClipperLib::ClipperOffset co;
            co.Clear();
            co.AddPath(*primary_it, ClipperLib::jtSquare, ClipperLib::etClosedPolygon);
            double offset_value = std::prev(etch_contour_map[layer_number].end(),1)->x;
            co.Execute(adjusted_paths, offset_value);
            push_freecad_prism( adjusted_paths[0],
                                true,
                                (proc_info_map[layer_number].z_start-9), 8, sub_layer);
        }
        // Generate all Al shapes
        build_additive_sub_layer(sub_layer);
        // Merge all AL shapes into sub-layer
        py_script.push_back("    layer_"+std::to_string(layer_number)+"_Al = "+
        "additives_"+sub_layer+"[0].fuse(additives_"+sub_layer+")");
        // py_script.push_back("    Part.show(Layer_"+std::to_string(layer_number)+"_Al)");
        py_script.push_back("    lyr_"
        +std::to_string(layer_number)+"_Al = My_doc.addObject(\"Part::Feature\",\"layer_"
        +std::to_string(layer_number)+"_Al\")");
        py_script.push_back("    lyr_"+std::to_string(layer_number)
        +"_Al.Shape = layer_"+std::to_string(layer_number)+"_Al");
        // Create list of all AlOX shapes
        sub_layer = std::to_string(layer_number)+"_AlOx";
        py_script.push_back("    additive_ingredients_"+sub_layer+" = []");
        for (auto primary_it = primary.begin();
            primary_it != primary_end;
            primary_it++)
        {
            ClipperLib::Paths adjusted_paths;
            ClipperLib::ClipperOffset co;
            co.Clear();
            co.AddPath(*primary_it, ClipperLib::jtSquare, ClipperLib::etClosedPolygon);
            double offset_value = std::prev(etch_contour_map[layer_number].end(),1)->x;
            co.Execute(adjusted_paths, offset_value);
            push_freecad_prism( adjusted_paths[0],
                                true,
                                (proc_info_map[layer_number].z_start-1), 1, sub_layer);
        }
        // Generate all AlOx shapes
        build_additive_sub_layer(sub_layer);
        // Merge AlOx shapes into sub-layer
        py_script.push_back("    layer_"+sub_layer+" = additives_"
        +sub_layer+"[0].fuse(additives_"+sub_layer+")");
        //py_script.push_back("    Part.show(Layer_" + sub_layer + ")");
        py_script.push_back("    lyr_"
        +sub_layer+" = My_doc.addObject(\"Part::Feature\",\"layer_"
        +sub_layer+"\")");
        py_script.push_back("    lyr_"+sub_layer
        +".Shape = layer_"+sub_layer);
    }
}